

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

int __thiscall FNodeBuilder::FVertexMap::InsertVertex(FVertexMap *this,FPrivVert *vert)

{
  TArray<int,_int> *pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  fixed_t y;
  int i;
  fixed_t x;
  long lVar5;
  int vertnum;
  uint blkcount [4];
  int blk [4];
  uint local_5c;
  uint local_58 [4];
  int local_48 [6];
  
  vert->segs = 0xffffffff;
  vert->segs2 = 0xffffffff;
  local_5c = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Push
                       (&this->MyBuilder->Vertices,vert);
  iVar3 = (vert->super_FSimpleVert).x;
  iVar2 = (vert->super_FSimpleVert).y;
  iVar4 = iVar3 + -6;
  if (iVar4 < this->MinX) {
    iVar4 = this->MinX;
  }
  x = iVar3 + 6;
  if (this->MaxX < x) {
    x = this->MaxX;
  }
  iVar3 = iVar2 + -6;
  if (iVar3 < this->MinY) {
    iVar3 = this->MinY;
  }
  y = iVar2 + 6;
  if (this->MaxY < y) {
    y = this->MaxY;
  }
  iVar2 = GetBlock(this,iVar4,iVar3);
  local_48[0] = iVar2;
  iVar3 = GetBlock(this,x,iVar3);
  local_48[1] = iVar3;
  iVar4 = GetBlock(this,iVar4,y);
  local_48[2] = iVar4;
  local_48[3] = GetBlock(this,x,y);
  pTVar1 = this->VertexGrid;
  local_58[0] = pTVar1[iVar2].Count;
  local_58[1] = pTVar1[iVar3].Count;
  local_58[2] = pTVar1[iVar4].Count;
  local_58[3] = pTVar1[local_48[3]].Count;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    if (this->VertexGrid[local_48[lVar5]].Count == local_58[lVar5]) {
      TArray<int,_int>::Push(this->VertexGrid + local_48[lVar5],(int *)&local_5c);
    }
  }
  return local_5c;
}

Assistant:

int FNodeBuilder::FVertexMap::InsertVertex (FNodeBuilder::FPrivVert &vert)
{
	int vertnum;

	vert.segs = DWORD_MAX;
	vert.segs2 = DWORD_MAX;
	vertnum = (int)MyBuilder.Vertices.Push (vert);

	// If a vertex is near a block boundary, then it will be inserted on
	// both sides of the boundary so that SelectVertexClose can find
	// it by checking in only one block.
	fixed_t minx = MAX (MinX, vert.x - VERTEX_EPSILON);
	fixed_t maxx = MIN (MaxX, vert.x + VERTEX_EPSILON);
	fixed_t miny = MAX (MinY, vert.y - VERTEX_EPSILON);
	fixed_t maxy = MIN (MaxY, vert.y + VERTEX_EPSILON);

	int blk[4] =
	{
		GetBlock (minx, miny),
		GetBlock (maxx, miny),
		GetBlock (minx, maxy),
		GetBlock (maxx, maxy)
	};
	unsigned int blkcount[4] =
	{
		VertexGrid[blk[0]].Size(),
		VertexGrid[blk[1]].Size(),
		VertexGrid[blk[2]].Size(),
		VertexGrid[blk[3]].Size()
	};
	for (int i = 0; i < 4; ++i)
	{
		if (VertexGrid[blk[i]].Size() == blkcount[i])
		{
			VertexGrid[blk[i]].Push (vertnum);
		}
	}

	return vertnum;
}